

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_GetOwnPropertyNames2(JSContext *ctx,JSValue obj1,int flags,int kind)

{
  JSAtom prop;
  JSShape *pJVar1;
  JSValue JVar2;
  JSValue JVar3;
  JSValue JVar4;
  undefined1 auVar5 [16];
  int iVar6;
  JSValueUnion JVar8;
  uint uVar7;
  ulong uVar9;
  ulong uVar10;
  int64_t iVar11;
  JSValue v;
  JSValue obj;
  JSValue obj_00;
  JSValue this_obj;
  JSValue v_00;
  JSValue JVar12;
  JSValue JVar13;
  JSValue JVar14;
  JSValue JVar15;
  JSValue JVar16;
  JSValue prop_00;
  JSValue this_obj_00;
  JSValue this_obj_01;
  uint32_t len;
  JSPropertyEnum *atoms;
  JSPropertyDescriptor desc;
  uint local_b4;
  JSValueUnion local_b0;
  JSValueUnion local_a8;
  int local_a0;
  uint local_9c;
  JSValueUnion local_98;
  JSValueUnion local_90;
  JSPropertyEnum *local_88;
  JSValueUnion local_80 [7];
  JSValueUnion local_48;
  ulong local_40;
  JSPropertyEnum *local_38;
  
  JVar12 = JS_ToObject(ctx,obj1);
  JVar8 = JVar12.u;
  if ((uint)JVar12.tag == 6) {
    iVar11 = 6;
    uVar10 = 0;
    uVar9 = 0;
    goto LAB_0014544f;
  }
  local_a8 = JVar8;
  iVar6 = JS_GetOwnPropertyNamesInternal
                    (ctx,&local_88,&local_b4,(JSObject *)JVar8.ptr,flags & 0xffffffef);
  if (iVar6 == 0) {
    pJVar1 = ctx->array_shape;
    (pJVar1->header).ref_count = (pJVar1->header).ref_count + 1;
    local_9c = flags;
    local_48 = JVar8;
    JVar13 = JS_NewObjectFromShape(ctx,pJVar1,2);
    this_obj.tag = JVar13.tag;
    uVar9 = (ulong)JVar13.u.ptr >> 0x20;
    if ((int)JVar13.tag != 6) {
      local_40 = (ulong)local_b4;
      if (local_40 != 0) {
        local_38 = local_88;
        v_00.tag = 3;
        local_98.float64 = local_a8.float64;
        uVar10 = 0;
        JVar15 = (JSValue)(ZEXT416((uint)flags) << 0x40);
        local_90.float64 = 0.0;
        local_b0 = JVar13.u;
        local_a0 = kind;
LAB_001454b9:
        JVar2.tag = v_00.tag;
        JVar2.u.float64 = JVar15.u.float64;
        prop = local_38[uVar10].atom;
        iVar11 = JVar15.tag;
        if ((local_9c & 0x10) == 0) {
LAB_00145536:
          if (local_a0 == 1) {
            obj_00.tag = JVar12.tag;
            obj_00.u.ptr = local_98.ptr;
            this_obj_01.tag = JVar12.tag;
            this_obj_01.u.ptr = local_98.ptr;
            JVar16 = JS_GetPropertyInternal(ctx,obj_00,prop,this_obj_01,0);
            JVar8 = JVar16.u;
            iVar6 = (int)JVar16.tag;
joined_r0x00145630:
            JVar15.tag = (int64_t)ctx;
            JVar15.u.float64 = JVar8.float64;
            uVar7 = 2;
            JVar13 = JVar16;
            if (iVar6 == 6) goto LAB_001456a6;
          }
          else {
            if (local_a0 != 2) {
              JVar16 = __JS_AtomToValue(ctx,prop,0);
              JVar8 = JVar16.u;
              iVar6 = (int)JVar16.tag;
              goto joined_r0x00145630;
            }
            pJVar1 = ctx->array_shape;
            (pJVar1->header).ref_count = (pJVar1->header).ref_count + 1;
            uVar7 = 2;
            JVar13 = JS_NewObjectFromShape(ctx,pJVar1,2);
            JVar8 = JVar13.u;
            JVar4.tag = (int64_t)ctx;
            JVar4.u.ptr = JVar8.ptr;
            JVar3.tag = (int64_t)JVar8.ptr;
            JVar3.u.float64 = JVar8.float64;
            JVar15.tag = iVar11;
            JVar15.u.ptr = JVar8.ptr;
            JVar16 = JVar13;
            if ((int)JVar13.tag == 6) goto LAB_001456a6;
            JVar15 = __JS_AtomToValue(ctx,prop,0);
            JVar8 = JVar15.u;
            uVar7 = 7;
            if ((int)JVar15.tag == 6) {
LAB_001455f1:
              JVar16.tag = JVar13.tag;
              JVar16.u.float64 = JVar8.float64;
              JVar15 = JVar3;
              goto LAB_001456a6;
            }
            local_80._0_16_ = (undefined1  [16])JVar15;
            iVar6 = JS_DefinePropertyValueValue(ctx,JVar13,(JSValue)ZEXT816(0),JVar15,0x4007);
            JVar8.float64 = 0.0;
            if (iVar6 < 0) goto LAB_001455f1;
            obj.tag = JVar12.tag;
            obj.u.ptr = local_98.ptr;
            this_obj_00.tag = JVar12.tag;
            this_obj_00.u.ptr = local_98.ptr;
            JVar15 = JS_GetPropertyInternal(ctx,obj,prop,this_obj_00,0);
            JVar8 = JVar15.u;
            if ((int)JVar15.tag == 6) goto LAB_001455f1;
            local_80._0_16_ = (undefined1  [16])JVar15;
            iVar6 = JS_DefinePropertyValueValue(ctx,JVar13,(JSValue)ZEXT816(1),JVar15,0x4007);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = JVar13.tag;
            JVar16 = (JSValue)(auVar5 << 0x40);
            JVar15 = JVar4;
            if (iVar6 < 0) goto LAB_001456a6;
          }
          iVar6 = local_90.int32;
          JVar8.float64 = (double)(local_90.float64 & 0xffffffffU);
          if (-1 < iVar6) {
            JVar8.float64 = local_90.float64 & 0xffffffffU;
          }
          iVar11 = 7;
          if (-1 < iVar6) {
            iVar11 = 0;
          }
          this_obj.u.ptr = local_b0.ptr;
          prop_00.tag = iVar11;
          prop_00.u.float64 = JVar8.float64;
          local_80._0_16_ = (undefined1  [16])JVar13;
          uVar7 = JS_DefinePropertyValueValue(ctx,this_obj,prop_00,JVar13,7);
          uVar7 = uVar7 >> 0x1e & 0xfffffffe;
          local_90._4_4_ = 0;
          local_90.int32 = iVar6 + 1;
          JVar16.tag = JVar13.tag;
          JVar16.u.float64 = local_90.float64;
          JVar15 = JVar13;
        }
        else {
          iVar6 = JS_GetOwnPropertyInternal
                            (ctx,(JSPropertyDescriptor *)local_80,(JSObject *)local_48.ptr,prop);
          if (iVar6 < 0) {
            uVar7 = 2;
LAB_00145526:
            JVar8.float64 = 0.0;
          }
          else {
            if (iVar6 == 0) {
              uVar7 = 5;
              goto LAB_00145526;
            }
            js_free_desc(ctx,(JSPropertyDescriptor *)local_80);
            JVar8._4_4_ = 0;
            JVar8.int32 = (local_80[0].int32 & 4) >> 2;
            uVar7 = (uint)((local_80._0_16_ & (undefined1  [16])0x4) == (undefined1  [16])0x0) * 5;
          }
          JVar16.tag = v_00.tag;
          JVar16.u.float64 = JVar8.float64;
          iVar11 = v_00.tag;
          JVar15 = JVar2;
          if (JVar8._0_1_ != '\0') goto LAB_00145536;
        }
LAB_001456a6:
        iVar11 = JVar15.tag;
        v_00.u = JVar15.u;
        v_00.tag = JVar16.tag;
        switch(uVar7) {
        case 0:
        case 5:
          goto switchD_001456bf_caseD_0;
        default:
          uVar10 = 0;
          uVar9 = 0;
          goto LAB_0014544f;
        case 2:
          JVar13.tag = this_obj.tag;
          JVar13.u.ptr = local_b0.ptr;
          goto LAB_001453c4;
        case 7:
          JS_FreeValue(ctx,v_00);
          JVar13.tag = this_obj.tag;
          JVar13.u.ptr = local_b0.ptr;
          goto LAB_001453c4;
        }
      }
      goto LAB_00145403;
    }
  }
  else {
    JVar13 = (JSValue)(ZEXT816(3) << 0x40);
    uVar9 = 0;
  }
LAB_001453c4:
  v.tag = JVar13.tag;
  local_80[0].ptr = (void *)((ulong)JVar13.u.ptr & 0xffffffff | uVar9 << 0x20);
  if ((0xfffffff4 < (uint)JVar13.tag) &&
     (iVar6 = *local_80[0].ptr, *(int *)local_80[0].ptr = iVar6 + -1, iVar6 < 2)) {
    v.u.ptr = local_80[0].ptr;
    __JS_FreeValueRT(ctx->rt,v);
  }
  JVar13 = (JSValue)(ZEXT816(6) << 0x40);
  uVar9 = 0;
  goto LAB_00145403;
switchD_001456bf_caseD_0:
  uVar10 = uVar10 + 1;
  if (local_40 == uVar10) goto LAB_0014574b;
  goto LAB_001454b9;
LAB_0014574b:
  JVar13.tag = this_obj.tag;
  JVar13.u.ptr = local_b0.ptr;
LAB_00145403:
  iVar11 = JVar13.tag;
  js_free_prop_enum(ctx,local_88,local_b4);
  local_80[0].ptr = local_a8.ptr;
  if ((0xfffffff4 < (uint)JVar12.tag) &&
     (iVar6 = *local_a8.ptr, *(int *)local_a8.ptr = iVar6 + -1, iVar6 < 2)) {
    JVar12.u.ptr = local_a8.ptr;
    __JS_FreeValueRT(ctx->rt,JVar12);
  }
  uVar9 = uVar9 << 0x20;
  uVar10 = (ulong)JVar13.u.ptr & 0xffffffff;
LAB_0014544f:
  JVar14.u.ptr = (void *)(uVar10 | uVar9);
  JVar14.tag = iVar11;
  return JVar14;
}

Assistant:

static JSValue JS_GetOwnPropertyNames2(JSContext *ctx, JSValueConst obj1,
                                       int flags, int kind)
{
    JSValue obj, r, val, key, value;
    JSObject *p;
    JSPropertyEnum *atoms;
    uint32_t len, i, j;

    r = JS_UNDEFINED;
    val = JS_UNDEFINED;
    obj = JS_ToObject(ctx, obj1);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    p = JS_VALUE_GET_OBJ(obj);
    if (JS_GetOwnPropertyNamesInternal(ctx, &atoms, &len, p, flags & ~JS_GPN_ENUM_ONLY))
        goto exception;
    r = JS_NewArray(ctx);
    if (JS_IsException(r))
        goto exception;
    for(j = i = 0; i < len; i++) {
        JSAtom atom = atoms[i].atom;
        if (flags & JS_GPN_ENUM_ONLY) {
            JSPropertyDescriptor desc;
            int res;

            /* Check if property is still enumerable */
            res = JS_GetOwnPropertyInternal(ctx, &desc, p, atom);
            if (res < 0)
                goto exception;
            if (!res)
                continue;
            js_free_desc(ctx, &desc);
            if (!(desc.flags & JS_PROP_ENUMERABLE))
                continue;
        }
        switch(kind) {
        default:
        case JS_ITERATOR_KIND_KEY:
            val = JS_AtomToValue(ctx, atom);
            if (JS_IsException(val))
                goto exception;
            break;
        case JS_ITERATOR_KIND_VALUE:
            val = JS_GetProperty(ctx, obj, atom);
            if (JS_IsException(val))
                goto exception;
            break;
        case JS_ITERATOR_KIND_KEY_AND_VALUE:
            val = JS_NewArray(ctx);
            if (JS_IsException(val))
                goto exception;
            key = JS_AtomToValue(ctx, atom);
            if (JS_IsException(key))
                goto exception1;
            if (JS_CreateDataPropertyUint32(ctx, val, 0, key, JS_PROP_THROW) < 0)
                goto exception1;
            value = JS_GetProperty(ctx, obj, atom);
            if (JS_IsException(value))
                goto exception1;
            if (JS_CreateDataPropertyUint32(ctx, val, 1, value, JS_PROP_THROW) < 0)
                goto exception1;
            break;
        }
        if (JS_CreateDataPropertyUint32(ctx, r, j++, val, 0) < 0)
            goto exception;
    }
    goto done;

exception1:
    JS_FreeValue(ctx, val);
exception:
    JS_FreeValue(ctx, r);
    r = JS_EXCEPTION;
done:
    js_free_prop_enum(ctx, atoms, len);
    JS_FreeValue(ctx, obj);
    return r;
}